

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O2

void __thiscall
amrex::PODVector<double,_std::allocator<double>_>::PODVector
          (PODVector<double,_std::allocator<double>_> *this,size_type a_size,
          value_type_conflict2 *a_value,allocator_type *a_allocator)

{
  size_type a_capacity;
  
  this->m_data = (pointer)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  a_capacity = GetNewCapacity(this,a_size);
  AllocateBuffer(this,a_capacity);
  this->m_size = a_size;
  std::__fill_n_a<double*,unsigned_long,double>(this->m_data,a_size,a_value);
  return;
}

Assistant:

PODVector (size_type a_size, const value_type& a_value,
                   const allocator_type& a_allocator = Allocator()) noexcept
            : Allocator(a_allocator), m_data(nullptr), m_size(0), m_capacity(0)
        {
            AllocateBuffer(GetNewCapacity(a_size));
            m_size = a_size;
            detail::uninitializedFillNImpl<Allocator>(m_data, a_size, a_value, *this);
        }